

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O0

void vault_monsters(chunk_conflict *c,loc grid,wchar_t depth,wchar_t num)

{
  _Bool _Var1;
  wchar_t wVar2;
  loc_conflict local_30;
  loc near;
  wchar_t i;
  wchar_t k;
  wchar_t num_local;
  wchar_t depth_local;
  chunk_conflict *c_local;
  loc grid_local;
  
  _Var1 = square_in_bounds((chunk *)c,(loc_conflict)grid);
  if (_Var1) {
    for (near.y = 0; near.y < num; near.y = near.y + 1) {
      for (near.x = 0; near.x < 9; near.x = near.x + 1) {
        wVar2 = scatter_ext(c,(loc *)&local_30,L'\x01',grid,L'\x01',true,square_isempty);
        if (wVar2 != L'\0') {
          pick_and_place_monster((chunk *)c,local_30,depth,true,true,'\v');
          break;
        }
      }
    }
  }
  return;
}

Assistant:

void vault_monsters(struct chunk *c, struct loc grid, int depth, int num)
{
	int k, i;

	/* If the starting location is illegal, don't even start */
	if (!square_in_bounds(c, grid)) return;

	/* Try to summon "num" monsters "near" the given location */
	for (k = 0; k < num; k++) {
		/* Try nine locations */
		for (i = 0; i < 9; i++) {
			struct loc near;

			/* Pick a nearby empty location. */
			if (scatter_ext(c, &near, 1, grid, 1, true,
					square_isempty) == 0) continue;

			/* Place the monster (allow groups) */
			pick_and_place_monster(c, near, depth, true, true,
				ORIGIN_DROP_SPECIAL);

			break;
		}
	}
}